

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::TypedFloatConstantGenerator::MakeInf
          (string *__return_storage_ptr__,TypedFloatConstantGenerator *this,bool neg,string *prefix)

{
  size_type sVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000011,neg) == 0) {
    std::operator+(__return_storage_ptr__,prefix,&this->pos_inf_number_);
  }
  else {
    sVar1 = (this->neg_inf_number_)._M_string_length;
    if (sVar1 == 0) {
      std::operator+(&local_40,"-",prefix);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_40,(ulong)(this->pos_inf_number_)._M_dataplus._M_p)
      ;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
    }
    else {
      std::operator+(__return_storage_ptr__,prefix,&this->neg_inf_number_);
    }
    if ((sVar1 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypedFloatConstantGenerator::MakeInf(
    bool neg, const std::string &prefix) const {
  if (neg)
    return !neg_inf_number_.empty() ? (prefix + neg_inf_number_)
                                    : ("-" + prefix + pos_inf_number_);
  else
    return prefix + pos_inf_number_;
}